

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_func_queue_examples.cpp
# Opt level: O0

void density_tests::
     LfFunctionQueueSamples<(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
     ::func_queue_try_put_samples(ostream *i_ostream)

{
  type_conflict tVar1;
  bool bVar2;
  value_type *pvVar3;
  Func_conflict *pFVar4;
  ostream *in_RDI;
  put_transaction<Func> transaction_1;
  bool invoked_2;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  queue_3;
  put_transaction<typename_std::decay<Func>::type> transaction;
  bool invoked_1;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  queue_2;
  bool invoked;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  queue_1;
  bool ok;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  queue;
  PrintScopeDuration dur;
  put_transaction<Func> local_408;
  put_transaction<Func> local_3e8;
  undefined1 local_3c1;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_3c0;
  Func_conflict local_318;
  put_transaction<typename_std::decay<Func>::type> local_308;
  put_transaction<Func> local_2e8;
  undefined1 local_2c1;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_2c0;
  int local_208;
  undefined1 local_201;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_200;
  anon_class_1_0_00000001 local_142;
  undefined1 local_141;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_140;
  PrintScopeDuration local_88 [2];
  
  PrintScopeDuration::PrintScopeDuration(local_88,in_RDI,"lock-free function queue put samples");
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_function_queue(&local_140);
  local_141 = density::
              lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
              ::
              try_push<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::_lambda()_1_>
                        ((lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
                          *)&local_140,progress_lock_free,&local_142);
  do {
    tVar1 = density::
            lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_consume(&local_140);
  } while (tVar1);
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_function_queue(&local_140);
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_function_queue(&local_200);
  local_201 = 0;
  local_208 = 7;
  bVar2 = density::
          lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
          ::
          try_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func,int>
                    ((lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_200,progress_lock_free,&local_208);
  if ((bVar2) &&
     (local_201 = density::
                  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::try_consume(&local_200), !(bool)local_201)) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                  ,0x121,
                  "static void density_tests::LfFunctionQueueSamples<density::function_manual_clear, density::concurrency_multiple, density::concurrency_single, density::consistency_sequential>::func_queue_try_put_samples(std::ostream &) [ERASURE = density::function_manual_clear, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_function_queue(&local_200);
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_function_queue(&local_2c0);
  local_2c1 = 0;
  local_318.m_string_1 = (char *)0x0;
  local_318.m_string_2 = (char *)0x0;
  density::
  lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  try_start_push<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
            (&local_308,
             (lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_2c0,progress_lock_free,&local_318);
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
  ::
  put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func,void>
            ((put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
              *)&local_2e8,&local_308);
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<Func>::~put_transaction(&local_308);
  bVar2 = density::lf_heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)&local_2e8);
  if (bVar2) {
    pvVar3 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::raw_allocate_copy<char[12]>
                       (&local_2e8,(char (*) [12])"Hello world");
    pFVar4 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::element<Func,_nullptr>(&local_2e8);
    pFVar4->m_string_1 = pvVar3;
    pvVar3 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::raw_allocate_copy<char[18]>
                       (&local_2e8,(char (*) [18])"\t(I\'m so happy)!!");
    pFVar4 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::element<Func,_nullptr>(&local_2e8);
    pFVar4->m_string_2 = pvVar3;
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::put_transaction<Func>::commit(&local_2e8);
    local_2c1 = density::
                lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                ::try_consume(&local_2c0);
    if (!(bool)local_2c1) {
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                    ,0x148,
                    "static void density_tests::LfFunctionQueueSamples<density::function_manual_clear, density::concurrency_multiple, density::concurrency_single, density::consistency_sequential>::func_queue_try_put_samples(std::ostream &) [ERASURE = density::function_manual_clear, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
  }
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<Func>::~put_transaction(&local_2e8);
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_function_queue(&local_2c0);
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_function_queue(&local_3c0);
  local_3c1 = 0;
  density::
  lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  try_start_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
            (&local_408,
             (lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_3c0,progress_lock_free);
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
  ::
  put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func,void>
            ((put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
              *)&local_3e8,&local_408);
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<Func>::~put_transaction(&local_408);
  bVar2 = density::lf_heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)&local_3e8);
  if (bVar2) {
    pvVar3 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::raw_allocate_copy<char[12]>
                       (&local_3e8,(char (*) [12])"Hello world");
    pFVar4 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::element<Func,_nullptr>(&local_3e8);
    pFVar4->m_string_1 = pvVar3;
    pvVar3 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::raw_allocate_copy<char[18]>
                       (&local_3e8,(char (*) [18])"\t(I\'m so happy)!!");
    pFVar4 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::element<Func,_nullptr>(&local_3e8);
    pFVar4->m_string_2 = pvVar3;
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::put_transaction<Func>::commit(&local_3e8);
    local_3c1 = density::
                lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                ::try_consume(&local_3c0);
    if (!(bool)local_3c1) {
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                    ,0x16e,
                    "static void density_tests::LfFunctionQueueSamples<density::function_manual_clear, density::concurrency_multiple, density::concurrency_single, density::consistency_sequential>::func_queue_try_put_samples(std::ostream &) [ERASURE = density::function_manual_clear, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
  }
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<Func>::~put_transaction(&local_3e8);
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_function_queue(&local_3c0);
  PrintScopeDuration::~PrintScopeDuration(local_88);
  return;
}

Assistant:

static void func_queue_try_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "lock-free function queue put samples");

            using namespace density;

            {
                //! [lf_function_queue try_push example 1]
                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                bool const ok =
                  queue.try_push(progress_lock_free, [] { std::cout << "Hello world!"; });

                while (queue.try_consume())
                    ;
                //! [lf_function_queue try_push example 1]
                (void)ok;
            }
            {
                //! [lf_function_queue try_emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                     queue;
                bool invoked = false;
                if (queue.template try_emplace<Func>(progress_lock_free, 7))
                {
                    invoked = queue.try_consume();
                    assert(invoked);
                }
                //! [lf_function_queue try_emplace example 1]
                (void)invoked;
            }
            {
                //! [lf_function_queue try_start_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                bool invoked = false;
                if (auto transaction = queue.try_start_push(progress_lock_free, Func{}))
                {
                    // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                    transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                    transaction.element().m_string_2 =
                      transaction.raw_allocate_copy("\t(I'm so happy)!!");

                    transaction.commit();

                    invoked = queue.try_consume();
                    assert(invoked);
                }
                //! [lf_function_queue try_start_push example 1]
                (void)invoked;
            }
            {
                //! [lf_function_queue try_start_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                     queue;
                bool invoked = false;
                if (auto transaction = queue.template try_start_emplace<Func>(progress_lock_free))
                {
                    // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                    transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                    transaction.element().m_string_2 =
                      transaction.raw_allocate_copy("\t(I'm so happy)!!");

                    transaction.commit();

                    invoked = queue.try_consume();
                    assert(invoked);
                }
                //! [lf_function_queue try_start_emplace example 1]
                (void)invoked;
            }
        }